

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interpreter.cpp
# Opt level: O0

void covscript_main(int args_size,char **args)

{
  char *pcVar1;
  initializer_list<cs_impl::any> __l;
  bool bVar2;
  byte bVar3;
  ostream *poVar4;
  undefined8 uVar5;
  element_type *peVar6;
  ulong uVar7;
  element_type *peVar8;
  repl *this;
  size_t sVar9;
  long in_RSI;
  int in_EDI;
  exception *e;
  int code;
  string line;
  ofstream log_stream;
  repl repl;
  raii_collector context_gc_1;
  context_t context_1;
  array arg_1;
  exception ne;
  exception *ce;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<cs::name_space>_>
  *it_1;
  iterator __end4_1;
  iterator __begin4_1;
  map_t<string,_namespace_t> *__range4_1;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<cs::name_space>_>
  *it;
  iterator __end4;
  iterator __begin4;
  map_t<string,_namespace_t> *__range4;
  ofstream out_1;
  ofstream out;
  raii_collector context_gc;
  context_t context;
  array arg;
  string path;
  int index;
  array *in_stack_00001448;
  string *in_stack_fffffffffffff2f8;
  process_context *in_stack_fffffffffffff300;
  undefined7 in_stack_fffffffffffff308;
  char in_stack_fffffffffffff30f;
  function<bool_(void_*)> *in_stack_fffffffffffff310;
  char (*in_stack_fffffffffffff318) [11];
  allocator_type *in_stack_fffffffffffff328;
  deque<cs_impl::any,_std::allocator<cs_impl::any>_> *in_stack_fffffffffffff330;
  iterator in_stack_fffffffffffff338;
  allocator *paVar10;
  ostream *in_stack_fffffffffffff340;
  deque<cs_impl::any,_std::allocator<cs_impl::any>_> *in_stack_fffffffffffff350;
  string *in_stack_fffffffffffff358;
  context_t *c;
  ostream *in_stack_fffffffffffff398;
  instance_type *in_stack_fffffffffffff3a0;
  istream *in_stack_fffffffffffff3c8;
  undefined1 ***pppuVar11;
  instance_type *in_stack_fffffffffffff3d0;
  undefined1 ***pppuVar12;
  process_context *in_stack_fffffffffffff448;
  undefined7 in_stack_fffffffffffff450;
  undefined1 in_stack_fffffffffffff457;
  char **in_stack_fffffffffffff4f8;
  int in_stack_fffffffffffff500;
  allocator local_af1;
  string *in_stack_fffffffffffff510;
  string local_ac8 [32];
  string *in_stack_fffffffffffff558;
  instance_type *in_stack_fffffffffffff560;
  string *in_stack_fffffffffffff6d8;
  repl *in_stack_fffffffffffff6e0;
  string *in_stack_fffffffffffff6e8;
  compiler_type *in_stack_fffffffffffff6f0;
  context_t local_8a8 [15];
  byte local_7b8;
  undefined1 **local_6f8;
  undefined8 *local_6f0;
  undefined1 **local_6e8;
  undefined8 local_6e0;
  reference local_5f0;
  iterator local_5e8;
  iterator local_5d8;
  map_t<string,_namespace_t> *local_5c8;
  reference local_5c0;
  iterator local_5b8;
  iterator local_5a8;
  map_t<string,_namespace_t> *local_598;
  ostream local_590 [512];
  undefined1 local_390 [512];
  undefined1 *local_190;
  undefined1 local_148 [110];
  undefined1 local_da;
  allocator local_d9;
  string local_d8 [39];
  allocator local_b1;
  string local_b0 [32];
  string local_90 [56];
  string local_58 [32];
  string local_38 [36];
  int local_14;
  long local_10;
  int local_4;
  
  local_10 = in_RSI;
  local_4 = in_EDI;
  local_14 = covscript_args(in_stack_fffffffffffff500,in_stack_fffffffffffff4f8);
  cs::get_import_path_abi_cxx11_();
  std::operator+(in_stack_fffffffffffff30f,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 in_stack_fffffffffffff300);
  std::__cxx11::string::operator+=((string *)(cs::current_process + 0x58),local_38);
  std::__cxx11::string::~string(local_38);
  std::__cxx11::string::~string(local_58);
  if ((show_help_info & 1U) == 0) {
    if ((show_version_info & 1U) == 0) {
      if (((::repl & 1U) != 0) || (local_14 == local_4)) {
        if ((silent & 1U) == 0) {
          poVar4 = std::operator<<((ostream *)&std::cout,
                                   "Covariant Script Programming Language Interpreter REPL\nVersion: "
                                  );
          poVar4 = std::operator<<(poVar4,(string *)(cs::current_process + 8));
          poVar4 = std::operator<<(poVar4," [");
          poVar4 = std::operator<<(poVar4,"GCC/Clang");
          poVar4 = std::operator<<(poVar4," on ");
          poVar4 = std::operator<<(poVar4,"Linux");
          poVar4 = std::operator<<(poVar4,
                                   "]\nCopyright (C) 2017-2025 Michael Lee. All rights reserved.\nPlease visit <http://covscript.org.cn/> for more information."
                                  );
          std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
        }
        local_6f8 = (undefined1 **)&local_6f0;
        cs_impl::any::make_constant<std::__cxx11::string,char_const(&)[11]>
                  (in_stack_fffffffffffff318);
        local_6e8 = (undefined1 **)&local_6f0;
        local_6e0 = 1;
        std::allocator<cs_impl::any>::allocator((allocator<cs_impl::any> *)0x124f0d);
        __l._M_len = (size_type)in_stack_fffffffffffff340;
        __l._M_array = in_stack_fffffffffffff338;
        std::deque<cs_impl::any,_std::allocator<cs_impl::any>_>::deque
                  (in_stack_fffffffffffff330,__l,in_stack_fffffffffffff328);
        std::allocator<cs_impl::any>::~allocator((allocator<cs_impl::any> *)0x124f41);
        pppuVar11 = (undefined1 ***)&local_6f0;
        pppuVar12 = &local_6e8;
        do {
          pppuVar12 = pppuVar12 + -1;
          cs_impl::any::~any((any *)0x124f76);
        } while (pppuVar12 != pppuVar11);
        for (; local_14 < local_4; local_14 = local_14 + 1) {
          cs_impl::any::make_constant<std::__cxx11::string,char*&>
                    ((char **)in_stack_fffffffffffff318);
          std::deque<cs_impl::any,_std::allocator<cs_impl::any>_>::emplace_back<cs_impl::any>
                    ((deque<cs_impl::any,_std::allocator<cs_impl::any>_> *)in_stack_fffffffffffff300
                     ,(any *)in_stack_fffffffffffff2f8);
          cs_impl::any::~any((any *)0x124ff0);
        }
        cs::create_context(in_stack_00001448);
        std::shared_ptr<cs::context_type>::shared_ptr
                  ((shared_ptr<cs::context_type> *)in_stack_fffffffffffff300,
                   (shared_ptr<cs::context_type> *)in_stack_fffffffffffff2f8);
        cs::raii_collector::raii_collector
                  ((raii_collector *)in_stack_fffffffffffff300,
                   (context_t *)in_stack_fffffffffffff2f8);
        std::shared_ptr<cs::context_type>::~shared_ptr((shared_ptr<cs::context_type> *)0x12517e);
        activate_sigint_handler();
        std::function<bool(void*)>::function<covscript_main(int,char**)::__1,void>
                  (in_stack_fffffffffffff310,
                   (anon_class_1_0_00000001 *)
                   CONCAT17(in_stack_fffffffffffff30f,in_stack_fffffffffffff308));
        cs::event_type::add_listener
                  ((event_type *)in_stack_fffffffffffff300,
                   (listener_type *)in_stack_fffffffffffff2f8);
        std::function<bool_(void_*)>::~function((function<bool_(void_*)> *)0x1251dc);
        std::function<bool(void*)>::function<covscript_main(int,char**)::__2,void>
                  (in_stack_fffffffffffff310,
                   (anon_class_1_0_00000001 *)
                   CONCAT17(in_stack_fffffffffffff30f,in_stack_fffffffffffff308));
        cs::event_type::add_listener
                  ((event_type *)in_stack_fffffffffffff300,
                   (listener_type *)in_stack_fffffffffffff2f8);
        std::function<bool_(void_*)>::~function((function<bool_(void_*)> *)0x12522f);
        this = (repl *)(cs::current_process + 0xd0);
        std::function<bool(void*)>::function<covscript_main(int,char**)::__3,void>
                  (in_stack_fffffffffffff310,
                   (anon_class_1_0_00000001 *)
                   CONCAT17(in_stack_fffffffffffff30f,in_stack_fffffffffffff308));
        cs::event_type::add_listener
                  ((event_type *)in_stack_fffffffffffff300,
                   (listener_type *)in_stack_fffffffffffff2f8);
        std::function<bool_(void_*)>::~function((function<bool_(void_*)> *)0x12527c);
        bVar2 = no_optimize;
        std::__shared_ptr_access<cs::context_type,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
        operator->((__shared_ptr_access<cs::context_type,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                    *)0x12529b);
        peVar6 = std::
                 __shared_ptr_access<cs::compiler_type,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                 operator->((__shared_ptr_access<cs::compiler_type,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)0x1252a3);
        peVar6->disable_optimizer = (bool)(bVar2 & 1);
        c = local_8a8;
        std::shared_ptr<cs::context_type>::shared_ptr
                  ((shared_ptr<cs::context_type> *)in_stack_fffffffffffff300,
                   (shared_ptr<cs::context_type> *)in_stack_fffffffffffff2f8);
        cs::repl::repl(this,c);
        std::shared_ptr<cs::context_type>::~shared_ptr((shared_ptr<cs::context_type> *)0x1252e8);
        std::ofstream::ofstream(&stack0xfffffffffffff558);
        std::__cxx11::string::string(local_ac8);
        local_7b8 = (silent ^ 0xffU) & 1;
        do {
          bVar3 = std::ios::operator!((ios *)((long)&std::cin + *(long *)(std::cin + -0x18)));
          if ((bVar3 & 1) != 0) {
            cs::process_context::on_process_exit_default_handler((void *)0x12535b);
          }
          if ((silent & 1U) == 0) {
            sVar9 = cs::repl::get_level((repl *)0x12546f);
            uVar7 = sVar9 * 2;
            paVar10 = &local_af1;
            std::allocator<char>::allocator();
            std::__cxx11::string::string((string *)&stack0xfffffffffffff510,uVar7,'.',paVar10);
            poVar4 = std::operator<<((ostream *)&std::cout,(string *)&stack0xfffffffffffff510);
            poVar4 = std::operator<<(poVar4,"> ");
            std::ostream::operator<<(poVar4,std::flush<char,std::char_traits<char>>);
            std::__cxx11::string::~string((string *)&stack0xfffffffffffff510);
            std::allocator<char>::~allocator((allocator<char> *)&local_af1);
          }
          std::getline<char,std::char_traits<char>,std::allocator<char>>
                    ((istream *)&std::cin,local_ac8);
          cs::process_context::poll_event(in_stack_fffffffffffff300);
          cs::repl::exec(in_stack_fffffffffffff6e0,in_stack_fffffffffffff6d8);
        } while( true );
      }
      pcVar1 = *(char **)(local_10 + (long)local_14 * 8);
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_b0,pcVar1,&local_b1);
      cs::process_path(in_stack_fffffffffffff358);
      std::__cxx11::string::~string(local_b0);
      std::allocator<char>::~allocator((allocator<char> *)&local_b1);
      bVar2 = std::operator!=((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              in_stack_fffffffffffff300,(char *)in_stack_fffffffffffff2f8);
      if (bVar2) {
        bVar2 = cs_impl::file_system::exist(in_stack_fffffffffffff510);
        if (((!bVar2) || (bVar2 = cs_impl::file_system::is_dir((string *)0x12431f), bVar2)) ||
           (bVar2 = cs_impl::file_system::can_read((string *)0x124342), !bVar2)) {
          local_da = 1;
          uVar5 = __cxa_allocate_exception(0x28);
          std::allocator<char>::allocator();
          std::__cxx11::string::string(local_d8,"invalid input file.",&local_d9);
          cs::fatal_error::fatal_error
                    ((fatal_error *)in_stack_fffffffffffff300,in_stack_fffffffffffff2f8);
          local_da = 0;
          __cxa_throw(uVar5,&cs::fatal_error::typeinfo,cs::fatal_error::~fatal_error);
        }
        cs::prepend_import_path
                  ((string *)CONCAT17(in_stack_fffffffffffff457,in_stack_fffffffffffff450),
                   in_stack_fffffffffffff448);
      }
      std::deque<cs_impl::any,_std::allocator<cs_impl::any>_>::deque
                ((deque<cs_impl::any,_std::allocator<cs_impl::any>_> *)0x1244d2);
      for (; local_14 < local_4; local_14 = local_14 + 1) {
        cs_impl::any::make_constant<std::__cxx11::string,char*&>((char **)in_stack_fffffffffffff318)
        ;
        std::deque<cs_impl::any,_std::allocator<cs_impl::any>_>::emplace_back<cs_impl::any>
                  ((deque<cs_impl::any,_std::allocator<cs_impl::any>_> *)in_stack_fffffffffffff300,
                   (any *)in_stack_fffffffffffff2f8);
        cs_impl::any::~any((any *)0x124531);
      }
      cs::create_context(in_stack_00001448);
      std::shared_ptr<cs::context_type>::shared_ptr
                ((shared_ptr<cs::context_type> *)in_stack_fffffffffffff300,
                 (shared_ptr<cs::context_type> *)in_stack_fffffffffffff2f8);
      cs::raii_collector::raii_collector
                ((raii_collector *)in_stack_fffffffffffff300,(context_t *)in_stack_fffffffffffff2f8)
      ;
      std::shared_ptr<cs::context_type>::~shared_ptr((shared_ptr<cs::context_type> *)0x1245db);
      local_190 = local_148;
      std::function<bool(void*)>::function<covscript_main(int,char**)::__0,void>
                (in_stack_fffffffffffff310,
                 (anon_class_8_1_bc11688f *)
                 CONCAT17(in_stack_fffffffffffff30f,in_stack_fffffffffffff308));
      cs::event_type::add_listener
                ((event_type *)in_stack_fffffffffffff300,(listener_type *)in_stack_fffffffffffff2f8)
      ;
      std::function<bool_(void_*)>::~function((function<bool_(void_*)> *)0x124644);
      bVar2 = no_optimize;
      std::__shared_ptr_access<cs::context_type,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
      operator->((__shared_ptr_access<cs::context_type,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                 0x124661);
      peVar6 = std::__shared_ptr_access<cs::compiler_type,_(__gnu_cxx::_Lock_policy)2,_false,_false>
               ::operator->((__shared_ptr_access<cs::compiler_type,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)0x124669);
      peVar6->disable_optimizer = (bool)(bVar2 & 1);
      uVar7 = std::__cxx11::string::empty();
      if ((uVar7 & 1) == 0) {
        std::__shared_ptr_access<cs::context_type,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
        operator->((__shared_ptr_access<cs::context_type,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                    *)0x12469a);
        std::__shared_ptr_access<cs::compiler_type,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
        operator->((__shared_ptr_access<cs::compiler_type,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                    *)0x1246a2);
        cs::compiler_type::import_csym
                  (in_stack_fffffffffffff6f0,in_stack_fffffffffffff6e8,
                   (string *)in_stack_fffffffffffff6e0);
      }
      bVar2 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              in_stack_fffffffffffff300,(char *)in_stack_fffffffffffff2f8);
      if (bVar2) {
        peVar8 = std::
                 __shared_ptr_access<cs::context_type,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                 operator->((__shared_ptr_access<cs::context_type,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)0x124759);
        std::__cxx11::string::operator=((string *)&peVar8->file_path,"STDIN");
        std::__shared_ptr_access<cs::context_type,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
        operator->((__shared_ptr_access<cs::context_type,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                    *)0x12477b);
        std::__shared_ptr_access<cs::instance_type,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
        operator->((__shared_ptr_access<cs::instance_type,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                    *)0x124787);
        cs::instance_type::compile(in_stack_fffffffffffff3d0,in_stack_fffffffffffff3c8);
      }
      else {
        std::__shared_ptr_access<cs::context_type,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
        operator->((__shared_ptr_access<cs::context_type,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                    *)0x1247c0);
        std::__shared_ptr_access<cs::instance_type,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
        operator->((__shared_ptr_access<cs::instance_type,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                    *)0x1247cc);
        cs::instance_type::compile(in_stack_fffffffffffff560,in_stack_fffffffffffff558);
      }
      if ((dump_ast & 1U) != 0) {
        uVar7 = std::__cxx11::string::empty();
        if ((uVar7 & 1) == 0) {
          std::ofstream::ofstream(local_390,(string *)&log_path_abi_cxx11_,_S_out);
          std::__shared_ptr_access<cs::context_type,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
          operator->((__shared_ptr_access<cs::context_type,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                      *)0x124828);
          std::__shared_ptr_access<cs::instance_type,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
          operator->((__shared_ptr_access<cs::instance_type,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                      *)0x124834);
          cs::instance_type::dump_ast(in_stack_fffffffffffff3a0,in_stack_fffffffffffff398);
          std::ofstream::~ofstream(local_390);
        }
        else {
          std::__shared_ptr_access<cs::context_type,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
          operator->((__shared_ptr_access<cs::context_type,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                      *)0x124888);
          std::__shared_ptr_access<cs::instance_type,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
          operator->((__shared_ptr_access<cs::instance_type,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                      *)0x124894);
          cs::instance_type::dump_ast(in_stack_fffffffffffff3a0,in_stack_fffffffffffff398);
        }
      }
      if ((dump_dependency & 1U) != 0) {
        uVar7 = std::__cxx11::string::empty();
        if ((uVar7 & 1) == 0) {
          std::ofstream::ofstream(local_590,(string *)&log_path_abi_cxx11_,_S_out);
          std::__shared_ptr_access<cs::context_type,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
          operator->((__shared_ptr_access<cs::context_type,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                      *)0x1248f5);
          peVar6 = std::
                   __shared_ptr_access<cs::compiler_type,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                   ::operator->((__shared_ptr_access<cs::compiler_type,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                 *)0x1248fd);
          local_598 = &peVar6->modules;
          local_5a8 = phmap::priv::
                      raw_hash_set<phmap::priv::FlatHashMapPolicy<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<cs::name_space>_>,_phmap::Hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_phmap::EqualTo<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<cs::name_space>_>_>_>
                      ::begin((raw_hash_set<phmap::priv::FlatHashMapPolicy<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<cs::name_space>_>,_phmap::Hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_phmap::EqualTo<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<cs::name_space>_>_>_>
                               *)0x124916);
          local_5b8 = phmap::priv::
                      raw_hash_set<phmap::priv::FlatHashMapPolicy<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<cs::name_space>_>,_phmap::Hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_phmap::EqualTo<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<cs::name_space>_>_>_>
                      ::end((raw_hash_set<phmap::priv::FlatHashMapPolicy<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<cs::name_space>_>,_phmap::Hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_phmap::EqualTo<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<cs::name_space>_>_>_>
                             *)0x124955);
          while( true ) {
            in_stack_fffffffffffff457 =
                 phmap::priv::operator!=
                           ((iterator *)in_stack_fffffffffffff300,
                            (iterator *)in_stack_fffffffffffff2f8);
            if (!(bool)in_stack_fffffffffffff457) break;
            local_5c0 = phmap::priv::
                        raw_hash_set<phmap::priv::FlatHashMapPolicy<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<cs::name_space>_>,_phmap::Hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_phmap::EqualTo<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<cs::name_space>_>_>_>
                        ::iterator::operator*((iterator *)0x1249c2);
            poVar4 = std::operator<<(local_590,(string *)local_5c0);
            std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
            phmap::priv::
            raw_hash_set<phmap::priv::FlatHashMapPolicy<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<cs::name_space>_>,_phmap::Hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_phmap::EqualTo<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<cs::name_space>_>_>_>
            ::iterator::operator++((iterator *)in_stack_fffffffffffff300);
          }
          std::ofstream::~ofstream(local_590);
        }
        else {
          std::__shared_ptr_access<cs::context_type,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
          operator->((__shared_ptr_access<cs::context_type,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                      *)0x124bdf);
          peVar6 = std::
                   __shared_ptr_access<cs::compiler_type,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                   ::operator->((__shared_ptr_access<cs::compiler_type,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                 *)0x124be7);
          local_5c8 = &peVar6->modules;
          local_5d8 = phmap::priv::
                      raw_hash_set<phmap::priv::FlatHashMapPolicy<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<cs::name_space>_>,_phmap::Hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_phmap::EqualTo<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<cs::name_space>_>_>_>
                      ::begin((raw_hash_set<phmap::priv::FlatHashMapPolicy<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<cs::name_space>_>,_phmap::Hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_phmap::EqualTo<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<cs::name_space>_>_>_>
                               *)0x124c00);
          local_5e8 = phmap::priv::
                      raw_hash_set<phmap::priv::FlatHashMapPolicy<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<cs::name_space>_>,_phmap::Hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_phmap::EqualTo<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<cs::name_space>_>_>_>
                      ::end((raw_hash_set<phmap::priv::FlatHashMapPolicy<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<cs::name_space>_>,_phmap::Hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_phmap::EqualTo<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<cs::name_space>_>_>_>
                             *)0x124c3f);
          while( true ) {
            bVar2 = phmap::priv::operator!=
                              ((iterator *)in_stack_fffffffffffff300,
                               (iterator *)in_stack_fffffffffffff2f8);
            if (!bVar2) break;
            local_5f0 = phmap::priv::
                        raw_hash_set<phmap::priv::FlatHashMapPolicy<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<cs::name_space>_>,_phmap::Hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_phmap::EqualTo<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<cs::name_space>_>_>_>
                        ::iterator::operator*((iterator *)0x124ca9);
            poVar4 = std::operator<<((ostream *)&std::cout,(string *)local_5f0);
            std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
            phmap::priv::
            raw_hash_set<phmap::priv::FlatHashMapPolicy<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<cs::name_space>_>,_phmap::Hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_phmap::EqualTo<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<cs::name_space>_>_>_>
            ::iterator::operator++((iterator *)in_stack_fffffffffffff300);
          }
        }
      }
      if ((compile_only & 1U) == 0) {
        std::__shared_ptr_access<cs::context_type,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
        operator->((__shared_ptr_access<cs::context_type,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                    *)0x124d2a);
        std::__shared_ptr_access<cs::instance_type,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
        operator->((__shared_ptr_access<cs::instance_type,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                    *)0x124d36);
        cs::instance_type::interpret
                  ((instance_type *)CONCAT17(in_stack_fffffffffffff457,in_stack_fffffffffffff450));
      }
      cs::raii_collector::~raii_collector((raii_collector *)in_stack_fffffffffffff300);
      std::shared_ptr<cs::context_type>::~shared_ptr((shared_ptr<cs::context_type> *)0x124dca);
      std::deque<cs_impl::any,_std::allocator<cs_impl::any>_>::~deque(in_stack_fffffffffffff350);
      std::__cxx11::string::~string(local_90);
    }
    else {
      poVar4 = std::operator<<((ostream *)&std::cout,"Version: ");
      poVar4 = std::operator<<(poVar4,(string *)(cs::current_process + 8));
      std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
      poVar4 = std::operator<<((ostream *)&std::cout,
                               "Licensed under the Apache License, Version 2.0 (the \"License\");\nyou may not use this file except in compliance with the License.\nYou may obtain a copy of the License at\n\nhttp://www.apache.org/licenses/LICENSE-2.0\n\nUnless required by applicable law or agreed to in writing, software\ndistributed under the License is distributed on an \"AS IS\" BASIS,\nWITHOUT WARRANTIES OR CONDITIONS OF ANY KIND, either express or implied.\nSee the License for the specific language governing permissions and\nlimitations under the License.\n\nCopyright (C) 2017-2025 Michael Lee\n\nThis software is registered with the National Copyright Administration\nof the People\'s Republic of China(Registration Number: 2020SR0408026)\nand is protected by the Copyright Law of the People\'s Republic of China.\n\nPlease visit http://covscript.org.cn for more information."
                              );
      std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
      std::operator<<((ostream *)&std::cout,"\nMetadata:\n");
      poVar4 = std::operator<<((ostream *)&std::cout,"  Import Path: ");
      poVar4 = std::operator<<(poVar4,(string *)(cs::current_process + 0x58));
      std::operator<<(poVar4,"\n");
      std::operator<<((ostream *)&std::cout,"  STD Version: ");
      cs_impl::any::any<cs::numeric>
                ((any *)in_stack_fffffffffffff310,
                 (numeric *)CONCAT17(in_stack_fffffffffffff30f,in_stack_fffffffffffff308));
      poVar4 = operator<<(in_stack_fffffffffffff340,in_stack_fffffffffffff338);
      std::operator<<(poVar4,"\n");
      cs_impl::any::~any((any *)0x124119);
      poVar4 = std::operator<<((ostream *)&std::cout,"  API Version: ");
      poVar4 = std::operator<<(poVar4,"230801");
      std::operator<<(poVar4,"\n");
      poVar4 = std::operator<<((ostream *)&std::cout,"  ABI Version: ");
      poVar4 = std::operator<<(poVar4,"230308");
      std::operator<<(poVar4,"\n");
      poVar4 = std::operator<<((ostream *)&std::cout,"  Runtime Env: ");
      poVar4 = std::operator<<(poVar4,"Linux");
      std::operator<<(poVar4,"\n");
      poVar4 = std::operator<<((ostream *)&std::cout,"  Compile Env: ");
      poVar4 = std::operator<<(poVar4,"GCC/Clang");
      std::operator<<(poVar4,"\n");
      std::ostream::operator<<(&std::cout,std::endl<char,std::char_traits<char>>);
    }
  }
  else {
    std::operator<<((ostream *)&std::cout,"Usage:\n");
    std::operator<<((ostream *)&std::cout,"    cs [options...] <FILE|STDIN> [arguments...]\n");
    std::operator<<((ostream *)&std::cout,"    cs [options...]\n");
    std::ostream::operator<<(&std::cout,std::endl<char,std::char_traits<char>>);
    poVar4 = std::operator<<((ostream *)&std::cout,"Interpreter Options:");
    std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
    std::operator<<((ostream *)&std::cout,"    Option                Mnemonic   Function\n");
    std::operator<<((ostream *)&std::cout,"  --compile-only         -c          Only compile\n");
    std::operator<<((ostream *)&std::cout,
                    "  --dump-ast             -d          Export abstract syntax tree\n");
    std::operator<<((ostream *)&std::cout,
                    "  --dependency           -r          Export module dependency\n");
    std::operator<<((ostream *)&std::cout,
                    "  --csym         <FILE>  -g <FILE>   Read cSYM from file\n");
    std::ostream::operator<<(&std::cout,std::endl<char,std::char_traits<char>>);
    poVar4 = std::operator<<((ostream *)&std::cout,"Interpreter REPL Options:");
    std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
    std::operator<<((ostream *)&std::cout,"    Option                Mnemonic   Function\n");
    std::operator<<((ostream *)&std::cout,
                    "  --silent               -s          Close the command prompt\n");
    std::operator<<((ostream *)&std::cout,"  --args <...>           -a <...>    Set the arguments\n"
                   );
    std::ostream::operator<<(&std::cout,std::endl<char,std::char_traits<char>>);
    poVar4 = std::operator<<((ostream *)&std::cout,"Common Options:");
    std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
    std::operator<<((ostream *)&std::cout,"    Option                Mnemonic   Function\n");
    std::operator<<((ostream *)&std::cout,"  --no-optimize          -o          Disable optimizer\n"
                   );
    std::operator<<((ostream *)&std::cout,
                    "  --help                 -h          Show help infomation\n");
    std::operator<<((ostream *)&std::cout,
                    "  --version              -v          Show version infomation\n");
    std::operator<<((ostream *)&std::cout,
                    "  --wait-before-exit     -w          Wait before process exit\n");
    std::operator<<((ostream *)&std::cout,
                    "  --stack-resize <SIZE>  -S <SIZE>   Reset the size of runtime stack\n");
    std::operator<<((ostream *)&std::cout,
                    "  --log-path     <PATH>  -l <PATH>   Set the log and AST exporting path\n");
    std::operator<<((ostream *)&std::cout,
                    "  --import-path  <PATH>  -i <PATH>   Set the import path\n");
    std::ostream::operator<<(&std::cout,std::endl<char,std::char_traits<char>>);
  }
  return;
}

Assistant:

void covscript_main(int args_size, char *args[])
{
	int index = covscript_args(args_size, args);
	cs::current_process->import_path += cs::path_delimiter + cs::get_import_path();
	if (show_help_info) {
		std::cout << "Usage:\n";
		std::cout << "    cs [options...] <FILE|STDIN> [arguments...]\n";
		std::cout << "    cs [options...]\n";
		std::cout << std::endl;
		std::cout << "Interpreter Options:" << std::endl;
		std::cout << "    Option                Mnemonic   Function\n";
		std::cout << "  --compile-only         -c          Only compile\n";
		std::cout << "  --dump-ast             -d          Export abstract syntax tree\n";
		std::cout << "  --dependency           -r          Export module dependency\n";
		std::cout << "  --csym         <FILE>  -g <FILE>   Read cSYM from file\n";
		std::cout << std::endl;
		std::cout << "Interpreter REPL Options:" << std::endl;
		std::cout << "    Option                Mnemonic   Function\n";
		std::cout << "  --silent               -s          Close the command prompt\n";
		std::cout << "  --args <...>           -a <...>    Set the arguments\n";
		std::cout << std::endl;
		std::cout << "Common Options:" << std::endl;
		std::cout << "    Option                Mnemonic   Function\n";
		std::cout << "  --no-optimize          -o          Disable optimizer\n";
		std::cout << "  --help                 -h          Show help infomation\n";
		std::cout << "  --version              -v          Show version infomation\n";
		std::cout << "  --wait-before-exit     -w          Wait before process exit\n";
		std::cout << "  --stack-resize <SIZE>  -S <SIZE>   Reset the size of runtime stack\n";
		std::cout << "  --log-path     <PATH>  -l <PATH>   Set the log and AST exporting path\n";
		std::cout << "  --import-path  <PATH>  -i <PATH>   Set the import path\n";
		std::cout << std::endl;
		return;
	}
	else if (show_version_info) {
		std::cout << "Version: " << cs::current_process->version << std::endl;
		std::cout << cs::copyright_info << std::endl;
		std::cout << "\nMetadata:\n";
		std::cout << "  Import Path: " << cs::current_process->import_path << "\n";
		std::cout << "  STD Version: " << cs::current_process->std_version << "\n";
		std::cout << "  API Version: " << CS_GET_VERSION_STR(COVSCRIPT_API_VERSION) << "\n";
		std::cout << "  ABI Version: " << CS_GET_VERSION_STR(COVSCRIPT_ABI_VERSION) << "\n";
		std::cout << "  Runtime Env: " << COVSCRIPT_PLATFORM_NAME << "\n";
		std::cout << "  Compile Env: " << COVSCRIPT_COMPILER_NAME << "\n";
		std::cout << std::endl;
		return;
	}
	if (!repl && index != args_size) {
		std::string path = cs::process_path(args[index]);
		if (path != "STDIN") {
			if (!cs_impl::file_system::exist(path) || cs_impl::file_system::is_dir(path) ||
			        !cs_impl::file_system::can_read(path))
				throw cs::fatal_error("invalid input file.");
			cs::prepend_import_path(path, cs::current_process);
		}
		cs::array arg;
		for (; index < args_size; ++index)
			arg.emplace_back(cs::var::make_constant<cs::string>(args[index]));
		cs::context_t context = cs::create_context(arg);
		cs::raii_collector context_gc(context);
		cs::current_process->on_process_exit.add_listener([&context](void *code) -> bool {
			cs::current_process->exit_code = *static_cast<int *>(code);
			throw cs::fatal_error("CS_EXIT");
			return true;
		});
		context->compiler->disable_optimizer = no_optimize;
		// Reads cSYM
		if (!csym_path.empty())
			context->compiler->import_csym(path, csym_path);
		try {
			if (path == "STDIN") {
				context->file_path = "STDIN";
				context->instance->compile(std::cin);
			}
			else
				context->instance->compile(path);
			if (dump_ast) {
				if (!log_path.empty()) {
					std::ofstream out(::log_path);
					context->instance->dump_ast(out);
				}
				else
					context->instance->dump_ast(std::cout);
			}
			if (dump_dependency) {
				if (!log_path.empty()) {
					std::ofstream out(::log_path);
					for (auto &it: context->compiler->modules)
						out << it.first << std::endl;
				}
				else {
					for (auto &it: context->compiler->modules)
						std::cout << it.first << std::endl;
				}
			}
			if (!compile_only)
				context->instance->interpret();
		}
		catch (const cs::exception &ce) {
			if (std::strstr(ce.what(), "CS_EXIT") == nullptr) {
				if (context->compiler->csyms.count(ce.file()) > 0) {
					cs::exception ne(ce);
					ne.relocate_to_csym(context->compiler->csyms[ce.file()]);
					throw ne;
				}
				else
					throw;
			}
		}
		catch (...) {
			throw;
		}
	}
	else {
		if (!silent)
			std::cout << "Covariant Script Programming Language Interpreter REPL\nVersion: "
			          << cs::current_process->version << " [" << COVSCRIPT_COMPILER_NAME << " on " << COVSCRIPT_PLATFORM_NAME << "]\n"
			          "Copyright (C) 2017-2025 Michael Lee. All rights reserved.\n"
			          "Please visit <http://covscript.org.cn/> for more information."
			          << std::endl;
		cs::array
		arg{cs::var::make_constant<cs::string>("<REPL_ENV>")};
		for (; index < args_size; ++index)
			arg.emplace_back(cs::var::make_constant<cs::string>(args[index]));
		cs::context_t context = cs::create_context(arg);
		cs::raii_collector context_gc(context);
		activate_sigint_handler();
		cs::current_process->on_process_exit.add_listener([](void *code) -> bool {
			cs::current_process->exit_code = *static_cast<int *>(code);
			throw cs::fatal_error("CS_EXIT");
		});
		cs::current_process->on_process_sigint.add_listener([](void *) -> bool {
			throw cs::fatal_error("CS_SIGINT");
		});
		cs::current_process->on_process_sigint.add_listener([](void *) -> bool {
			std::cin.clear();
			return false;
		});
		context->compiler->disable_optimizer = no_optimize;
		cs::repl repl(context);
		std::ofstream log_stream;
		std::string line;
		repl.echo = !silent;
		while (true) {
			try {
#ifdef COVSCRIPT_PLATFORM_WIN32
				if (!silent)
					std::cout << std::string(repl.get_level() * 2, '.') << "> " << std::flush;
				// Workaround: https://stackoverflow.com/a/26763490
				while (true) {
					cs::current_process->poll_event();
					std::getline(std::cin, line);
					if (std::cin)
						break;
				}
#else
				if (!std::cin) {
					int code = 0;
					cs::process_context::on_process_exit_default_handler(&code);
				}
				if (!silent)
					std::cout << std::string(repl.get_level() * 2, '.') << "> " << std::flush;
				std::getline(std::cin, line);
				cs::current_process->poll_event();
#endif
				repl.exec(line);
			}
			catch (const std::exception &e) {
				if (std::strstr(e.what(), "CS_SIGINT") != nullptr) {
					cs::process_context::cleanup_context();
					repl.reset_status();
					activate_sigint_handler();
				}
				else if (std::strstr(e.what(), "CS_EXIT") == nullptr) {
					if (!log_path.empty()) {
						if (!log_stream.is_open())
							log_stream.open(::log_path);
						if (log_stream)
							log_stream << e.what() << std::endl;
						else
							std::cerr << "Write log failed." << std::endl;
					}
					std::cerr << e.what() << std::endl;
				}
				else
					break;
			}
			catch (...) {
				throw;
			}
		}
	}
}